

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> * __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedRead::tryPumpFrom
          (Maybe<kj::Promise<unsigned_long>_> *__return_storage_ptr__,BlockedRead *this,
          AsyncInputStream *input,uint64_t amount)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  ulong uVar2;
  void *pvVar3;
  Fault f;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  
  if ((this->canceler).list.ptr != (AdapterBase *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x2d0,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&f);
  }
  pvVar3 = (void *)(this->minBytes - this->readSoFar);
  if (this->readSoFar <= this->minBytes && pvVar3 != (void *)0x0) {
    if (amount < pvVar3) {
      pvVar3 = (void *)amount;
    }
    uVar2 = (this->readBuffer).size_;
    if (amount < uVar2) {
      uVar2 = amount;
    }
    (*input->_vptr_AsyncInputStream[1])(&local_78,input,(this->readBuffer).ptr,pvVar3,uVar2);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_78,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:727:17),_kj::_::PropagateException>
               ::anon_class_32_4_e1da9b0a_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00430290;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
    this_00[1].dependency.disposer = (Disposer *)input;
    this_00[1].dependency.ptr = (PromiseNode *)amount;
    this_00[1].continuationTracePtr = pvVar3;
    f.exception = (Exception *)
                  &_::
                   HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
                   ::instance;
    _::maybeChain<unsigned_long>(&local_50,(Promise<unsigned_long> *)&f);
    pPVar1 = local_50.ptr;
    local_40.disposer = local_50.disposer;
    local_50.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_50);
    local_88.disposer = local_50.disposer;
    local_88.ptr = pPVar1;
    local_40.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_40);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&f);
    newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
              ((kj *)&local_68,&this->canceler,(Promise<unsigned_long> *)&local_88);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.disposer = local_68.disposer;
    (__return_storage_ptr__->ptr).field_1.value.super_PromiseBase.node.ptr = local_68.ptr;
    local_68.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_68);
    Own<kj::_::PromiseNode>::dispose(&local_88);
    Own<kj::_::PromiseNode>::dispose(&local_78);
    return __return_storage_ptr__;
  }
  _::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x2d2,FAILED,"minBytes > readSoFar","");
  _::Debug::Fault::fatal(&f);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }